

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O1

CURLSHcode curl_share_cleanup(CURLSH *sh)

{
  CURLSHcode CVar1;
  
  CVar1 = CURLSHE_INVALID;
  if ((sh != (CURLSH *)0x0) && (*sh == 0x7e117a1e)) {
    if (*(code **)((long)sh + 0x10) != (code *)0x0) {
      (**(code **)((long)sh + 0x10))(0,1,2,*(undefined8 *)((long)sh + 0x20));
    }
    if (*(int *)((long)sh + 8) == 0) {
      if ((*(byte *)((long)sh + 4) & 0x20) != 0) {
        Curl_cpool_destroy((cpool *)((long)sh + 0x30));
      }
      Curl_dnscache_destroy((Curl_dnscache *)((long)sh + 0xa0));
      Curl_cookie_cleanup(*(CookieInfo **)((long)sh + 0xd0));
      Curl_hsts_cleanup((hsts **)((long)sh + 0xf0));
      if (*(Curl_ssl_scache **)((long)sh + 0xf8) != (Curl_ssl_scache *)0x0) {
        Curl_ssl_scache_destroy(*(Curl_ssl_scache **)((long)sh + 0xf8));
        *(undefined8 *)((long)sh + 0xf8) = 0;
      }
      Curl_psl_destroy((PslCache *)((long)sh + 0xd8));
      Curl_close((Curl_easy **)((long)sh + 0x28));
      if (*(code **)((long)sh + 0x18) != (code *)0x0) {
        (**(code **)((long)sh + 0x18))(0,1,*(undefined8 *)((long)sh + 0x20));
      }
      *(undefined4 *)sh = 0;
      (*Curl_cfree)(sh);
      CVar1 = CURLSHE_OK;
    }
    else {
      CVar1 = CURLSHE_IN_USE;
      if (*(code **)((long)sh + 0x18) != (code *)0x0) {
        (**(code **)((long)sh + 0x18))(0,1,*(undefined8 *)((long)sh + 0x20));
      }
    }
  }
  return CVar1;
}

Assistant:

CURLSHcode
curl_share_cleanup(CURLSH *sh)
{
  struct Curl_share *share = sh;
  if(!GOOD_SHARE_HANDLE(share))
    return CURLSHE_INVALID;

  if(share->lockfunc)
    share->lockfunc(NULL, CURL_LOCK_DATA_SHARE, CURL_LOCK_ACCESS_SINGLE,
                    share->clientdata);

  if(share->dirty) {
    if(share->unlockfunc)
      share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
    return CURLSHE_IN_USE;
  }

  if(share->specifier & (1 << CURL_LOCK_DATA_CONNECT)) {
    Curl_cpool_destroy(&share->cpool);
  }

  Curl_dnscache_destroy(&share->dnscache);

#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
  Curl_cookie_cleanup(share->cookies);
#endif

#ifndef CURL_DISABLE_HSTS
  Curl_hsts_cleanup(&share->hsts);
#endif

#ifdef USE_SSL
  if(share->ssl_scache) {
    Curl_ssl_scache_destroy(share->ssl_scache);
    share->ssl_scache = NULL;
  }
#endif

  Curl_psl_destroy(&share->psl);
  Curl_close(&share->admin);

  if(share->unlockfunc)
    share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
  share->magic = 0;
  free(share);

  return CURLSHE_OK;
}